

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pnm_io.cc
# Opt level: O2

string * __thiscall
gimage::(anonymous_namespace)::readPNMToken_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,istream *in)

{
  uint uVar1;
  int iVar2;
  char c;
  ostringstream s;
  char local_199;
  ostringstream local_198 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  std::istream::get((char *)this);
  uVar1 = *(uint *)(this + *(long *)(*(long *)this + -0x18) + 0x20);
  while ((uVar1 & 2) == 0) {
    while ((((byte)this[*(long *)(*(long *)this + -0x18) + 0x20] & 2) == 0 &&
           (iVar2 = isspace((int)local_199), iVar2 != 0))) {
      std::istream::get((char *)this);
    }
    if (local_199 != '#') break;
    while (uVar1 = *(uint *)(this + *(long *)(*(long *)this + -0x18) + 0x20), (uVar1 & 2) == 0) {
      std::istream::get((char *)this);
    }
  }
  do {
    if (((byte)this[*(long *)(*(long *)this + -0x18) + 0x20] & 2) != 0) {
LAB_0011af09:
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream(local_198);
      return __return_storage_ptr__;
    }
    iVar2 = isspace((int)local_199);
    if ((local_199 == 0x23) || (iVar2 != 0)) {
      if (local_199 == '#') {
        std::istream::unget();
      }
      goto LAB_0011af09;
    }
    std::operator<<((ostream *)local_198,local_199);
    std::istream::get((char *)this);
  } while( true );
}

Assistant:

std::string readPNMToken(std::istream &in)
{
  char c;
  std::ostringstream s;

  // read the first character of the token (ignoring white spaces and
  // comments in front the token)

  in.get(c);

  while (!in.eof())
  {
    while (!in.eof() && isspace(c))
    {
      in.get(c);
    }

    if (c == '#')
    {
      while (!in.eof() && c != '\n' && c != '\r')
      {
        in.get(c);
      }
    }
    else
    {
      break;
    }
  }

  // reading a token until white space or start of comment

  while (!in.eof() && !isspace(c) && c != '#')
  {
    s << c;
    in.get(c);
  }

  // put last character back if it was the start of a comment

  if (!in.eof() && c == '#')
  {
    in.unget();
  }

  return s.str();
}